

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

bool __thiscall Js::PolymorphicInlineCache::HasType_Flags(PolymorphicInlineCache *this,Type *type)

{
  bool bVar1;
  uint uVar2;
  uint inlineCacheIndex;
  Type *type_local;
  PolymorphicInlineCache *this_local;
  
  uVar2 = GetInlineCacheIndexForType(this,type);
  bVar1 = InlineCache::HasType_Flags(this->inlineCaches + uVar2,type);
  return bVar1;
}

Assistant:

bool PolymorphicInlineCache::HasType_Flags(const Type * type) const
    {
        uint inlineCacheIndex = GetInlineCacheIndexForType(type);
        return inlineCaches[inlineCacheIndex].HasType_Flags(type);
    }